

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O1

bool dxil_spv::emit_shufflevector_instruction(Impl *impl,ShuffleVectorInst *inst)

{
  Id arg;
  uint32_t lit;
  Operation *this;
  Value *value;
  Type *this_00;
  uint i;
  uint uVar1;
  uint index;
  
  this = Converter::Impl::allocate(impl,OpVectorShuffle,(Value *)inst);
  uVar1 = 0;
  do {
    value = LLVMBC::Instruction::getOperand(&inst->super_Instruction,uVar1);
    arg = Converter::Impl::get_id_for_value(impl,value,0);
    Operation::add_id(this,arg);
    uVar1 = uVar1 + 1;
  } while (uVar1 == 1);
  this_00 = LLVMBC::Value::getType((Value *)inst);
  uVar1 = LLVMBC::Type::getVectorNumElements(this_00);
  if (uVar1 != 0) {
    index = 0;
    do {
      lit = LLVMBC::ShuffleVectorInst::getMaskValue(inst,index);
      Operation::add_literal(this,lit);
      index = index + 1;
    } while (uVar1 != index);
  }
  Converter::Impl::add(impl,this,false);
  return true;
}

Assistant:

bool emit_shufflevector_instruction(Converter::Impl &impl, const llvm::ShuffleVectorInst *inst)
{
	Operation *op = impl.allocate(spv::OpVectorShuffle, inst);

	for (unsigned i = 0; i < 2; i++)
		op->add_id(impl.get_id_for_value(inst->getOperand(i)));

	unsigned num_outputs = inst->getType()->getVectorNumElements();
	for (unsigned i = 0; i < num_outputs; i++)
		op->add_literal(inst->getMaskValue(i));

	impl.add(op);
	return true;
}